

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression *
slang::ast::Expression::bindName
          (Compilation *comp,NameSyntax *syntax,InvocationExpressionSyntax *invocation,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  ulong uVar1;
  TempVarSymbol *symbol;
  underlying_type uVar2;
  bitmask<slang::ast::LookupFlags> flags;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Expression *pEVar7;
  RandomizeDetails *pRVar8;
  int iVar9;
  Expression *unaff_RBX;
  SourceRange SVar10;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  ASTContext *in_stack_fffffffffffffd30;
  InvocationExpressionSyntax *in_stack_fffffffffffffd38;
  LookupResult result;
  undefined1 local_68 [24];
  size_t sStack_50;
  size_t local_48;
  undefined1 local_40;
  undefined4 local_3f;
  undefined3 uStack_3b;
  undefined1 local_38;
  
  if (((invocation != (InvocationExpressionSyntax *)0x0) &&
      (invocation->arguments != (ArgumentListSyntax *)0x0)) ||
     (iVar6 = 0, ((comp->options).flags.m_bits & 4) != 0)) {
    iVar6 = 2;
  }
  uVar1 = (context->flags).m_bits;
  iVar9 = ((uint)uVar1 & 0x40) * 0x20;
  iVar3 = iVar9 + 0x4004;
  if ((uVar1 >> 0x2c & 1) == 0) {
    iVar3 = iVar9;
  }
  uVar2 = iVar3 + iVar6;
  flags.m_bits = uVar2 + 0x1020;
  if ((int)(comp->options).languageVersion < 1) {
    flags.m_bits = uVar2;
  }
  if ((uVar1 >> 0x29 & 1) == 0) {
    flags.m_bits = uVar2;
  }
  symbol = context->firstTempVar;
  pRVar8 = context->randomizeDetails;
  if (((symbol != (TempVarSymbol *)0x0) || (pRVar8 != (RandomizeDetails *)0x0)) ||
     (context->assertionInstance != (AssertionInstanceDetails *)0x0)) {
    if (symbol != (TempVarSymbol *)0x0) {
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ = (pointer)result.selectors.
                        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                        .firstElement;
      result.found = (Symbol *)0x0;
      result.systemSubroutine._0_5_ = 0;
      result.systemSubroutine._5_3_ = 0;
      result.upwardCount = 0;
      result.flags.m_bits = '\0';
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len = 0;
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .cap = 4;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
           (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                    firstElement;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      bVar4 = Lookup::findTempVar((context->scope).ptr,symbol,syntax,&result);
      if (bVar4) {
        LookupResult::reportDiags(&result,context);
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        sourceRange.endLoc = (SourceLocation)invocation;
        sourceRange.startLoc = SVar10.endLoc;
        unaff_RBX = bindLookupResult((Expression *)comp,(Compilation *)&result,
                                     (LookupResult *)SVar10.startLoc,sourceRange,
                                     (InvocationExpressionSyntax *)withClause,
                                     (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                     in_stack_fffffffffffffd30);
      }
      LookupResult::~LookupResult(&result);
      if (bVar4) {
        return unaff_RBX;
      }
      pRVar8 = context->randomizeDetails;
    }
    if ((pRVar8 != (RandomizeDetails *)0x0) && (pRVar8->classType != (Scope *)0x0)) {
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ = (pointer)result.selectors.
                        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                        .firstElement;
      result.found = (Symbol *)0x0;
      result.systemSubroutine._0_5_ = 0;
      result.systemSubroutine._5_3_ = 0;
      result.upwardCount = 0;
      result.flags.m_bits = '\0';
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len = 0;
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .cap = 4;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
           (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                    firstElement;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      bVar4 = Lookup::withinClassRandomize(context,syntax,flags,&result);
      if (bVar4) {
        LookupResult::reportDiags(&result,context);
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        sourceRange_01.endLoc = (SourceLocation)invocation;
        sourceRange_01.startLoc = SVar10.endLoc;
        unaff_RBX = bindLookupResult((Expression *)comp,(Compilation *)&result,
                                     (LookupResult *)SVar10.startLoc,sourceRange_01,
                                     (InvocationExpressionSyntax *)withClause,
                                     (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                     in_stack_fffffffffffffd30);
        bVar4 = false;
      }
      else {
        bVar5 = LookupResult::hasError(&result);
        bVar4 = true;
        if (bVar5) {
          LookupResult::reportDiags(&result,context);
          bVar4 = false;
          unaff_RBX = badExpr(comp,(Expression *)0x0);
        }
      }
      LookupResult::~LookupResult(&result);
      if (!bVar4) {
        return unaff_RBX;
      }
    }
    in_stack_fffffffffffffd38 = (InvocationExpressionSyntax *)withClause;
    if (context->assertionInstance != (AssertionInstanceDetails *)0x0) {
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ = (pointer)result.selectors.
                        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                        .firstElement;
      result.found = (Symbol *)0x0;
      result.systemSubroutine._0_5_ = 0;
      result.systemSubroutine._5_3_ = 0;
      result.upwardCount = 0;
      result.flags.m_bits = '\0';
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len = 0;
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .cap = 4;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
           (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                    firstElement;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      bVar4 = Lookup::findAssertionLocalVar(context,syntax,&result);
      if (bVar4) {
        LookupResult::reportDiags(&result,context);
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        sourceRange_02.endLoc = (SourceLocation)invocation;
        sourceRange_02.startLoc = SVar10.endLoc;
        unaff_RBX = bindLookupResult((Expression *)comp,(Compilation *)&result,
                                     (LookupResult *)SVar10.startLoc,sourceRange_02,
                                     (InvocationExpressionSyntax *)withClause,
                                     (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                     in_stack_fffffffffffffd30);
      }
      LookupResult::~LookupResult(&result);
      in_stack_fffffffffffffd38 = (InvocationExpressionSyntax *)withClause;
      if (bVar4) {
        return unaff_RBX;
      }
    }
  }
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)result.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  result.found = (Symbol *)0x0;
  result.systemSubroutine._0_5_ = 0;
  result.systemSubroutine._5_3_ = 0;
  result.upwardCount = 0;
  result.flags.m_bits = '\0';
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                firstElement;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap =
       result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap;
  Lookup::name(syntax,context,flags,&result);
  LookupResult::reportDiags(&result,context);
  if (CONCAT35(result.systemSubroutine._5_3_,result.systemSubroutine._0_5_) == 0) {
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    sourceRange_00.endLoc = (SourceLocation)invocation;
    sourceRange_00.startLoc = SVar10.endLoc;
    pEVar7 = bindLookupResult((Expression *)comp,(Compilation *)&result,
                              (LookupResult *)SVar10.startLoc,sourceRange_00,
                              (InvocationExpressionSyntax *)withClause,
                              (ArrayOrRandomizeMethodExpressionSyntax *)context,
                              in_stack_fffffffffffffd30);
  }
  else {
    if (invocation != (InvocationExpressionSyntax *)0x0) {
      syntax = (NameSyntax *)invocation;
    }
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    local_68._8_8_ = (context->scope).ptr;
    local_48 = 0;
    local_68._16_8_ = (value_type_pointer)0x0;
    sStack_50 = 0;
    local_3f = 0;
    uStack_3b = 0;
    local_68._0_8_ = CONCAT35(result.systemSubroutine._5_3_,result.systemSubroutine._0_5_);
    local_40 = 0;
    local_38 = 1;
    pEVar7 = CallExpression::fromLookup
                       ((CallExpression *)comp,(Compilation *)local_68,(Subroutine *)0x0,
                        (Expression *)invocation,(InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,SVar10,
                        (ASTContext *)in_stack_fffffffffffffd38);
  }
  LookupResult::~LookupResult(&result);
  return pEVar7;
}

Assistant:

Expression& Expression::bindName(Compilation& comp, const NameSyntax& syntax,
                                 const InvocationExpressionSyntax* invocation,
                                 const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                 const ASTContext& context) {
    bitmask<LookupFlags> flags = LookupFlags::None;
    if ((invocation && invocation->arguments) ||
        comp.hasFlag(CompilationFlags::AllowUseBeforeDeclare)) {
        flags |= LookupFlags::AllowDeclaredAfter;
    }

    if (context.flags.has(ASTFlags::StaticInitializer))
        flags |= LookupFlags::StaticInitializer;

    if (context.flags.has(ASTFlags::BindInstantiation))
        flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

    if (context.flags.has(ASTFlags::TypeOperator) &&
        comp.languageVersion() >= LanguageVersion::v1800_2023) {
        // v1800-2023: Type operator expressions are allowed to reference
        // incomplete forward class types now.
        flags |= LookupFlags::AllowIncompleteForwardTypedefs | LookupFlags::TypeReference;
    }

    // Special case scenarios: temporary variables, class-scoped randomize calls,
    // and expanding sequences and properties.
    if (context.firstTempVar || context.randomizeDetails || context.assertionInstance) {
        // If we have any temporary variables, they need to be findable even though they aren't
        // added to any scope. Check for that case and manually look for its name here.
        if (context.firstTempVar) {
            LookupResult result;
            if (Lookup::findTempVar(*context.scope, *context.firstTempVar, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }

        if (context.randomizeDetails && context.randomizeDetails->classType) {
            // Inside a class-scoped randomize call, first do a lookup in the class scope.
            // If it's not found, we proceed to do a normal lookup.
            LookupResult result;
            if (Lookup::withinClassRandomize(context, syntax, flags, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
            else if (result.hasError()) {
                result.reportDiags(context);
                return badExpr(comp, nullptr);
            }
        }

        if (context.assertionInstance) {
            // Look for a matching local assertion variable.
            LookupResult result;
            if (Lookup::findAssertionLocalVar(context, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }
    }

    // Normal name lookup and resolution.
    LookupResult result;
    Lookup::name(syntax, context, flags, result);
    result.reportDiags(context);

    if (result.systemSubroutine) {
        // There won't be any selectors here; this gets checked in the lookup call.
        SLANG_ASSERT(result.selectors.empty());

        SourceRange callRange = invocation ? invocation->sourceRange() : syntax.sourceRange();
        CallExpression::SystemCallInfo callInfo{result.systemSubroutine, context.scope, {}};
        return CallExpression::fromLookup(comp, callInfo, nullptr, invocation, withClause,
                                          callRange, context);
    }

    return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause, context);
}